

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FeatureSet::SharedCtor(FeatureSet *this,Arena *arena)

{
  Arena *arena_local;
  FeatureSet *this_local;
  
  MessageLite::internal_visibility();
  Impl_::Impl_((Impl_ *)&this->field_0);
  memset((void *)((long)&this->field_0 + 0x20),0,0x20);
  return;
}

Assistant:

inline void FeatureSet::SharedCtor(::_pb::Arena* PROTOBUF_NULLABLE arena) {
  new (&_impl_) Impl_(internal_visibility(), arena);
  ::memset(reinterpret_cast<char *>(&_impl_) +
               offsetof(Impl_, field_presence_),
           0,
           offsetof(Impl_, default_symbol_visibility_) -
               offsetof(Impl_, field_presence_) +
               sizeof(Impl_::default_symbol_visibility_));
}